

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O2

eSegType ON_LinetypeSegment::SegmentTypeFromUnsigned(uint segment_type_as_unsigned)

{
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (2 < segment_type_as_unsigned) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
               ,0x44,"","Invalid segment_type_as_unsigned value.",in_R8,in_R9,
               segment_type_as_unsigned);
    segment_type_as_unsigned = stLine;
  }
  return segment_type_as_unsigned;
}

Assistant:

ON_LinetypeSegment::eSegType ON_LinetypeSegment::SegmentTypeFromUnsigned(
  unsigned int segment_type_as_unsigned
  )
{
  switch (segment_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_LinetypeSegment::eSegType::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_LinetypeSegment::eSegType::stLine);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_LinetypeSegment::eSegType::stSpace);
  }
  ON_ERROR("Invalid segment_type_as_unsigned value.");
  return ON_LinetypeSegment::eSegType::stLine;
}